

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_avx2.c
# Opt level: O0

void av1_apply_temporal_filter_avx2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  undefined4 uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  double dVar7;
  double dVar8;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000020;
  int in_stack_00000028;
  undefined4 in_stack_00000030;
  long in_stack_00000040;
  long in_stack_00000048;
  int xx;
  int yy;
  int jj;
  int ii;
  uint j;
  uint k;
  uint i;
  double decay_factor;
  double n_decay;
  double inv_num_ref_pixels;
  int num_ref_pixels;
  int ss_y_shift;
  int ss_x_shift;
  uint8_t *ref;
  int frame_offset;
  uint32_t frame_stride;
  uint32_t plane_w;
  uint32_t plane_h;
  int plane;
  int plane_offset;
  double distance_threshold;
  double distance;
  MV mv;
  int subblock_idx;
  uint32_t luma_sse_sum [1024];
  uint16_t frame_sse [1088];
  double d_factor [4];
  double s_decay;
  double q_decay;
  double weight_factor;
  double inv_factor;
  int min_frame_size;
  int frame_width;
  int frame_height;
  int mb_width;
  int mb_height;
  int is_high_bitdepth;
  undefined4 in_stack_ffffffffffffe61c;
  int in_stack_ffffffffffffe620;
  double local_19d0;
  double local_19c8;
  double local_19b8;
  double local_19b0;
  double local_19a8;
  double local_19a0;
  int local_1998;
  int local_198c;
  int local_1988;
  uint local_1984;
  uint local_197c;
  int local_1938;
  int local_1934;
  short local_1920;
  short sStack_191e;
  int local_191c;
  uint16_t local_1918 [2048];
  uint16_t local_918 [792];
  double in_stack_fffffffffffffd18;
  double in_stack_fffffffffffffd20;
  double in_stack_fffffffffffffd28;
  double in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd3c;
  int in_stack_fffffffffffffd40;
  uint in_stack_fffffffffffffd44;
  uint8_t *in_stack_fffffffffffffd48;
  uint in_stack_fffffffffffffd54;
  uint8_t *in_stack_fffffffffffffd58;
  double local_98 [4];
  double local_78;
  double local_70;
  undefined8 local_68;
  undefined8 local_60;
  int local_58;
  int local_54;
  int local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  int local_40;
  long local_30;
  
  local_44 = *(uint *)(in_RDI + 0xc0) & 8;
  local_48 = (uint)block_size_high[in_DL];
  local_4c = (uint)block_size_wide[in_DL];
  local_50 = *(int *)(in_RDI + 0x18);
  local_54 = *(int *)(in_RDI + 0x10);
  local_1998 = local_54;
  if (local_50 < local_54) {
    local_1998 = local_50;
  }
  local_58 = local_1998;
  local_60 = 0x3f81111111111111;
  local_68 = 0x3fa5555555555555;
  local_40 = in_R9D;
  local_30 = in_RSI;
  local_19a8 = pow((double)in_stack_00000020 / 20.0,2.0);
  if (1e-05 <= local_19a8) {
    if (1.0 < local_19a8) {
      local_19a8 = 1.0;
    }
    local_19a0 = local_19a8;
  }
  else {
    local_19a0 = 1e-05;
  }
  local_70 = local_19a0;
  if (0x7f < in_stack_00000020) {
    local_70 = pow((double)in_stack_00000020 / 64.0,2.0);
    local_70 = local_70 * 0.5;
  }
  local_19b8 = pow((double)in_stack_00000028 / 4.0,2.0);
  if (1e-05 <= local_19b8) {
    if (1.0 < local_19b8) {
      local_19b8 = 1.0;
    }
    local_19b0 = local_19b8;
  }
  else {
    local_19b0 = 1e-05;
  }
  local_78 = local_19b0;
  memset(local_98,0,0x20);
  memset(local_918,0,0x880);
  memset(local_1918,0,0x1000);
  for (local_191c = 0; local_191c < 4; local_191c = local_191c + 1) {
    uVar1 = *(undefined4 *)(in_stack_00000010 + (long)local_191c * 4);
    local_1920 = (short)uVar1;
    dVar7 = pow((double)(int)local_1920,2.0);
    sStack_191e = (short)((uint)uVar1 >> 0x10);
    dVar8 = pow((double)(int)sStack_191e,2.0);
    dVar7 = sqrt(dVar7 + dVar8);
    local_19c8 = (double)local_58 * 0.1;
    if (local_19c8 <= 1.0) {
      local_19c8 = 1.0;
    }
    local_98[local_191c] = dVar7 / local_19c8;
    if (local_98[local_191c] <= 1.0) {
      local_19d0 = 1.0;
    }
    else {
      local_19d0 = local_98[local_191c];
    }
    local_98[local_191c] = local_19d0;
  }
  local_1934 = 0;
  for (local_1938 = 0; local_1938 < local_40; local_1938 = local_1938 + 1) {
    uVar4 = (int)local_48 >>
            ((byte)*(undefined4 *)(local_30 + (long)local_1938 * 0xa30 + 0x18) & 0x1f);
    uVar5 = (int)local_4c >>
            ((byte)*(undefined4 *)(local_30 + (long)local_1938 * 0xa30 + 0x14) & 0x1f);
    bVar2 = (char)*(undefined4 *)(local_30 + (long)local_1938 * 0xa30 + 0x14) -
            (char)*(undefined4 *)(local_30 + 0x14);
    bVar3 = (char)*(undefined4 *)(local_30 + (long)local_1938 * 0xa30 + 0x18) -
            (char)*(undefined4 *)(local_30 + 0x18);
    dVar7 = *(double *)(in_stack_00000008 + (long)local_1938 * 8);
    log(dVar7 + dVar7 + 5.0);
    if (local_1938 == 1) {
      for (local_197c = 0; local_197c < uVar4; local_197c = local_197c + 1) {
        for (local_1984 = 0; local_1984 < uVar5; local_1984 = local_1984 + 1) {
          for (local_1988 = 0; local_1988 < 1 << (bVar3 & 0x1f); local_1988 = local_1988 + 1) {
            for (local_198c = 0; local_198c < 1 << (bVar2 & 0x1f); local_198c = local_198c + 1) {
              uVar6 = (ulong)(local_197c * 0x20 + local_1984);
              *(uint *)(local_1918 + uVar6 * 2) =
                   (uint)local_918[(int)(((local_197c << (bVar3 & 0x1f)) + local_1988) * 0x22 +
                                        (local_1984 << (bVar2 & 0x1f)) + local_198c)] +
                   *(int *)(local_1918 + uVar6 * 2);
            }
          }
        }
      }
    }
    apply_temporal_filter
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,in_stack_fffffffffffffd48,
               in_stack_fffffffffffffd44,in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
               (int *)(in_stack_00000040 + (long)local_1934 * 4),
               (uint *)(in_stack_00000048 + (long)local_1934 * 2),local_918,local_1918,
               (uint32_t *)local_98,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               (double *)CONCAT44(in_stack_ffffffffffffe61c,in_stack_00000030),
               in_stack_ffffffffffffe620);
    local_1934 = uVar4 * uVar5 + local_1934;
  }
  return;
}

Assistant:

void av1_apply_temporal_filter_avx2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with avx2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with avx2!");
  assert(!is_high_bitdepth && "Only support low bit-depth with avx2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint16_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint8_t *ref = frame_to_filter->buffers[plane] + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx];
            }
          }
        }
      }
    }

    apply_temporal_filter(ref, frame_stride, pred + plane_offset, plane_w,
                          plane_w, plane_h, subblock_mses, accum + plane_offset,
                          count + plane_offset, frame_sse, luma_sse_sum,
                          inv_num_ref_pixels, decay_factor, inv_factor,
                          weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}